

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  void *in_RDI;
  RunContext *in_stack_00000070;
  
  ~RunContext(in_stack_00000070);
  operator_delete(in_RDI,0x1f0);
  return;
}

Assistant:

RunContext::~RunContext() {
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, aborting()));
    }